

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-close.c
# Opt level: O2

int run_test_loop_close(void)

{
  int iVar1;
  char *pcVar2;
  undefined8 uStack_370;
  uv_loop_t loop;
  
  loop.data = &loop;
  iVar1 = uv_loop_init(&loop);
  if (iVar1 == 0) {
    if ((uv_loop_t *)loop.data == &loop) {
      uv_timer_init(&loop,&timer_handle);
      uv_timer_start(&timer_handle,timer_cb,100);
      iVar1 = uv_loop_close(&loop);
      if (iVar1 == -0x10) {
        uv_run(&loop,0);
        uv_close(&timer_handle,0);
        iVar1 = uv_run(&loop,0);
        if (iVar1 == 0) {
          if ((uv_loop_t *)loop.data == &loop) {
            iVar1 = uv_loop_close(&loop);
            if (iVar1 == 0) {
              if ((uv_loop_t *)loop.data == &loop) {
                return 0;
              }
              pcVar2 = "loop.data == (void*) &loop";
              uStack_370 = 0x36;
            }
            else {
              pcVar2 = "0 == uv_loop_close(&loop)";
              uStack_370 = 0x35;
            }
          }
          else {
            pcVar2 = "loop.data == (void*) &loop";
            uStack_370 = 0x34;
          }
        }
        else {
          pcVar2 = "r == 0";
          uStack_370 = 0x32;
        }
      }
      else {
        pcVar2 = "UV_EBUSY == uv_loop_close(&loop)";
        uStack_370 = 0x2c;
      }
    }
    else {
      pcVar2 = "loop.data == (void*) &loop";
      uStack_370 = 0x27;
    }
  }
  else {
    pcVar2 = "0 == uv_loop_init(&loop)";
    uStack_370 = 0x26;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-close.c"
          ,uStack_370,pcVar2);
  abort();
}

Assistant:

TEST_IMPL(loop_close) {
  int r;
  uv_loop_t loop;

  loop.data = &loop;
  ASSERT(0 == uv_loop_init(&loop));
  ASSERT(loop.data == (void*) &loop);

  uv_timer_init(&loop, &timer_handle);
  uv_timer_start(&timer_handle, timer_cb, 100, 100);

  ASSERT(UV_EBUSY == uv_loop_close(&loop));

  uv_run(&loop, UV_RUN_DEFAULT);

  uv_close((uv_handle_t*) &timer_handle, NULL);
  r = uv_run(&loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(loop.data == (void*) &loop);
  ASSERT(0 == uv_loop_close(&loop));
  ASSERT(loop.data == (void*) &loop);

  return 0;
}